

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cradix-improved.c
# Opt level: O0

void RDFK(LPPSTR *GrpKP,LPPSTR a,UINT n,LPPSTR ta,UINT *count,UINT d)

{
  int *piVar1;
  uint local_90;
  uint local_8c;
  uint j_1;
  uint j;
  uchar cache [32];
  UINT UStack_60;
  uchar c;
  UINT gs;
  UINT *cptr;
  UINT i;
  LPPSTR tc;
  LPPSTR ak;
  UINT d_local;
  UINT *count_local;
  LPPSTR ta_local;
  UINT n_local;
  LPPSTR a_local;
  LPPSTR *GrpKP_local;
  
  cache[0x1f] = '\0';
  for (cptr = (UINT *)0x0; cptr < (UINT *)(n - (n & 0x1f)); cptr = cptr + 4) {
    for (local_8c = 0; local_8c < 0x20; local_8c = local_8c + 1) {
      *(uchar *)((long)&j_1 + (ulong)local_8c) = a[(long)cptr + (ulong)local_8c][d];
    }
    for (local_90 = 0; local_90 < 0x20; local_90 = local_90 + 1) {
      count[*(byte *)((long)&j_1 + (ulong)local_90)] =
           count[*(byte *)((long)&j_1 + (ulong)local_90)] + 1;
    }
  }
  for (; gs = (UINT)count, cptr < n; cptr = (UINT *)((long)cptr + 1)) {
    count[a[(long)cptr][d]] = count[a[(long)cptr][d]] + 1;
  }
  for (; *(long *)gs == 0; gs = gs + 8) {
  }
  UStack_60 = n;
  if (n <= *(ulong *)gs) {
    cache[0x1f] = (uchar)((long)(gs - (long)count) >> 3);
    UStack_60 = 0;
  }
  if (UStack_60 == 0) {
    if ((cache[0x1f] == '\0') || (count[cache[0x1f]] < 0x15)) {
      if ((1 < n) && (cache[0x1f] != '\0')) {
        insertion_sort(a,(int)n,d);
      }
    }
    else {
      _sp->sa = a;
      _sp->sk = (LPBYTE)0x0;
      _sp->sn = (int)n;
      piVar1 = &_sp->sb;
      _sp = _sp + 1;
      *piVar1 = (int)d + 1;
    }
    count[cache[0x1f]] = 0;
  }
  else {
    *GrpKP = a;
    tc = a;
    for (cptr = (UINT *)0x0; cptr < (UINT *)0xff; cptr = (UINT *)((long)cptr + 1)) {
      tc = tc + count[(long)cptr];
      GrpKP[(long)cptr + 1] = tc;
    }
    memcpy(ta,a,n << 3);
    i = (UINT)ta;
    for (cptr = (UINT *)0x0; cptr < n; cptr = (UINT *)((long)cptr + 1)) {
      *GrpKP[ta[(long)cptr][d]] = *(uchar **)i;
      GrpKP[ta[(long)cptr][d]] = GrpKP[ta[(long)cptr][d]] + 1;
      i = i + 8;
    }
    tc = a;
    for (cptr = (UINT *)0x0; cptr < (UINT *)0xff; cptr = (UINT *)((long)cptr + 1)) {
      if ((cptr == (UINT *)0x0) || (count[(long)cptr] < 0x15)) {
        if ((1 < count[(long)cptr]) && (cptr != (UINT *)0x0)) {
          insertion_sort(tc,(int)count[(long)cptr],d);
        }
      }
      else {
        _sp->sa = tc;
        _sp->sk = (LPBYTE)0x0;
        _sp->sn = (int)count[(long)cptr];
        piVar1 = &_sp->sb;
        _sp = _sp + 1;
        *piVar1 = (int)d + 1;
      }
      tc = tc + count[(long)cptr];
      count[(long)cptr] = 0;
    }
  }
  return;
}

Assistant:

static
void RDFK(LPPSTR* GrpKP, LPPSTR a, UINT n, LPPSTR ta,
		UINT* count, UINT d)
{ /* Read Directly From Keys */
	LPPSTR ak, tc; UINT i, *cptr, gs; unsigned char c=0;
	for (i=0; i<n-n%32; i+=32) {
		unsigned char cache[32];
		for (unsigned j=0; j<32; ++j) cache[j] = a[i+j][d];
		for (unsigned j=0; j<32; ++j) ++count[cache[j]];
	}
	for (; i<n; i++) count[a[i][d]]++;
	cptr=&count[AL]; while (*cptr<1) cptr++;
	if (*cptr<n) gs=n;
	else { c=(cptr-&count[AL])+AL; gs=0; }
	if (!gs) {
		if (splittable(c)) push(a, 0, n, d+1);
		else if (n>1 && c>0) insertion_sort(a, n, d);
		count[c]=0; return;
	}
	GrpKP[AL]=a;
	for (ak=a, i=AL; i<AH; i++) GrpKP[i+1]=ak+=count[i];
	memcpy(ta, a, sizeof(LPSTR)*n);
	for (i=0, tc=ta; i<n; i++, tc++) {
		*GrpKP[ta[i][d]]=*tc; GrpKP[ta[i][d]]++;
	}
	for (ak=a, i=AL; i<AH; i++) {
		if (splittable(i)) push(ak, 0, count[i], d+1);
		else if (count[i]>1 && i>0) insertion_sort(ak, count[i], d);
		ak+=count[i]; count[i]=0;
	}
}